

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.hpp
# Opt level: O3

float rsg::anon_unknown_0::getWeight<rsg::SqrtOp>
                (GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  
  fVar1 = 0.0;
  if (0.0 < state->m_programParams->exponentialBaseWeight) {
    fVar1 = UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SqrtOp>_>
            ::getWeight(state,valueRange);
    fVar1 = fVar1 * state->m_programParams->exponentialBaseWeight;
  }
  return fVar1;
}

Assistant:

const ProgramParameters&	getProgramParameters		(void) const	{ return m_programParams;	}